

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucol.cpp
# Opt level: O0

void ucol_getUCAVersion_63(UCollator *coll,uint8_t *info)

{
  undefined1 local_24;
  byte local_23;
  byte local_22;
  Collator *pCStack_20;
  UVersionInfo v;
  Collator *c;
  uint8_t *info_local;
  UCollator *coll_local;
  
  pCStack_20 = icu_63::Collator::fromUCollator(coll);
  if (pCStack_20 != (Collator *)0x0) {
    (*(pCStack_20->super_UObject)._vptr_UObject[0x16])(pCStack_20,&local_24);
    *info = (uint8_t)((int)(uint)local_23 >> 3);
    info[1] = local_23 & 7;
    info[2] = (uint8_t)((int)(uint)local_22 >> 6);
    info[3] = '\0';
  }
  return;
}

Assistant:

U_CAPI void U_EXPORT2
ucol_getUCAVersion(const UCollator* coll, UVersionInfo info) {
    const Collator *c = Collator::fromUCollator(coll);
    if(c != NULL) {
        UVersionInfo v;
        c->getVersion(v);
        // Note: This is tied to how the current implementation encodes the UCA version
        // in the overall getVersion().
        // Alternatively, we could load the root collator and get at lower-level data from there.
        // Either way, it will reflect the input collator's UCA version only
        // if it is a known implementation.
        // It would be cleaner to make this a virtual Collator method.
        info[0] = v[1] >> 3;
        info[1] = v[1] & 7;
        info[2] = v[2] >> 6;
        info[3] = 0;
    }
}